

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O3

void duckdb::InternalApproxTopKState::CopyValue
               (ApproxTopKValue *value,ApproxTopKString *input,AggregateInputData *input_data)

{
  uint uVar1;
  uint64_t uVar2;
  data_ptr_t __dest;
  size_t v;
  char *pcVar3;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 local_20;
  
  (value->str_val).hash = input->hash;
  uVar1 = (input->str).value.pointer.length;
  v = (size_t)uVar1;
  if (v < 0xd) {
    (value->str_val).hash = input->hash;
    pcVar3 = (input->str).value.pointer.ptr;
    *(undefined8 *)&(value->str_val).str.value = *(undefined8 *)&(input->str).value;
    (value->str_val).str.value.pointer.ptr = pcVar3;
  }
  else {
    value->size = uVar1;
    if (value->capacity < uVar1) {
      uVar2 = NextPowerOfTwo(v);
      value->capacity = (uint32_t)uVar2;
      __dest = ArenaAllocator::Allocate(input_data->allocator,uVar2 & 0xffffffff);
      value->dataptr = (char *)__dest;
      v = (size_t)value->size;
    }
    else {
      __dest = (data_ptr_t)value->dataptr;
    }
    if ((input->str).value.pointer.length < 0xd) {
      pcVar3 = (char *)((long)&(input->str).value + 4);
    }
    else {
      pcVar3 = (input->str).value.pointer.ptr;
    }
    switchD_015de399::default(__dest,pcVar3,v);
    pcVar3 = value->dataptr;
    uVar1 = value->size;
    if ((ulong)uVar1 < 0xd) {
      local_20 = 0;
      local_28 = 0;
      uStack_24 = 0;
      if (uVar1 != 0) {
        switchD_015de399::default(&local_28,pcVar3,(ulong)uVar1);
      }
    }
    else {
      local_28 = *(undefined4 *)pcVar3;
      uStack_24 = SUB84(pcVar3,0);
      local_20 = (undefined4)((ulong)pcVar3 >> 0x20);
    }
    (value->str_val).str.value.pointer.length = uVar1;
    *(ulong *)((long)&(value->str_val).str.value + 4) = CONCAT44(uStack_24,local_28);
    *(undefined4 *)((long)&(value->str_val).str.value + 0xc) = local_20;
  }
  return;
}

Assistant:

static void CopyValue(ApproxTopKValue &value, const ApproxTopKString &input, AggregateInputData &input_data) {
		value.str_val.hash = input.hash;
		if (input.str.IsInlined()) {
			// no need to copy
			value.str_val = input;
			return;
		}
		value.size = UnsafeNumericCast<uint32_t>(input.str.GetSize());
		if (value.size > value.capacity) {
			// need to re-allocate for this value
			value.capacity = UnsafeNumericCast<uint32_t>(NextPowerOfTwo(value.size));
			value.dataptr = char_ptr_cast(input_data.allocator.Allocate(value.capacity));
		}
		// copy over the data
		memcpy(value.dataptr, input.str.GetData(), value.size);
		value.str_val.str = string_t(value.dataptr, value.size);
	}